

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypt.c
# Opt level: O2

int crypt_init_arcfour128
              (LIBSSH2_SESSION *session,LIBSSH2_CRYPT_METHOD *method,uchar *iv,int *free_iv,
              uchar *secret,int *free_secret,int encrypt,void **abstract)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  uchar block [8];
  
  iVar2 = crypt_init(session,method,iv,free_iv,secret,free_secret,encrypt,abstract);
  if (iVar2 == 0) {
    piVar1 = (int *)*abstract;
    for (lVar3 = -0x600; lVar3 != 0; lVar3 = lVar3 + 8) {
      _libssh2_cipher_crypt
                ((EVP_CIPHER_CTX **)(piVar1 + 4),*(_func_EVP_CIPHER_ptr **)(piVar1 + 2),*piVar1,
                 block,(long)method->blocksize,0);
    }
  }
  return iVar2;
}

Assistant:

static int
crypt_init_arcfour128(LIBSSH2_SESSION * session,
                      const LIBSSH2_CRYPT_METHOD * method,
                      unsigned char *iv, int *free_iv,
                      unsigned char *secret, int *free_secret,
                      int encrypt, void **abstract)
{
    int rc;

    rc = crypt_init(session, method, iv, free_iv, secret, free_secret,
                    encrypt, abstract);
    if(rc == 0) {
        struct crypt_ctx *cctx = *(struct crypt_ctx **) abstract;
        unsigned char block[8];
        size_t discard = 1536;
        for(; discard; discard -= 8)
            _libssh2_cipher_crypt(&cctx->h, cctx->algo, cctx->encrypt, block,
                                  method->blocksize, MIDDLE_BLOCK);
                               /* Not all middle, but here it doesn't matter */
    }

    return rc;
}